

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

void __thiscall chatra::TemporaryObject::setReference(TemporaryObject *this,Reference sourceRef)

{
  TemporaryObject *this_local;
  Reference sourceRef_local;
  
  this->type = ScopeRef;
  this_local = (TemporaryObject *)sourceRef.node;
  Reference::operator=(&this->targetRef,(Reference *)&this_local);
  clearRestrictions(this);
  return;
}

Assistant:

void TemporaryObject::setReference(Reference sourceRef) {
	type = Type::ScopeRef;
	this->targetRef = sourceRef;
	clearRestrictions();
}